

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Kf(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  Gia_Man_t *pNew;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  Jf_Par_t Pars;
  char Buffer [200];
  Jf_Par_t local_200;
  char local_f8 [200];
  
  Kf_ManSetDefaultPars(&local_200);
  Extra_UtilGetoptReset();
LAB_00283935:
  iVar1 = Extra_UtilGetopt(argc,argv,"KCPDWaekmdcgtsvwh");
  iVar5 = globalUtilOptind;
  if (iVar1 < 0x50) {
    if (iVar1 < 0x44) {
      if (iVar1 != 0x43) {
        if (iVar1 == -1) {
          if (pAbc->pGia == (Gia_Man_t *)0x0) {
            pcVar3 = "Empty GIA network.\n";
          }
          else {
            pNew = Kf_ManPerformMapping(pAbc->pGia,&local_200);
            if (pNew != (Gia_Man_t *)0x0) {
              Abc_FrameUpdateGia(pAbc,pNew);
              return 0;
            }
            pcVar3 = "Abc_CommandAbc9Kf(): Mapping into LUTs has failed.\n";
          }
          iVar5 = -1;
          goto LAB_00283df7;
        }
        goto switchD_0028395b_caseD_62;
      }
      if (globalUtilOptind < argc) {
        uVar2 = atoi(argv[globalUtilOptind]);
        globalUtilOptind = iVar5 + 1;
        local_200.nCutNum = uVar2;
        if (((int)uVar2 < 1) || (local_200.nCutNumMax < (int)uVar2)) {
          pcVar3 = "This number of cuts (%d) is not supported.\n";
          goto LAB_00283b59;
        }
        goto LAB_00283935;
      }
      pcVar3 = "Command line switch \"-C\" should be followed by a positive integer.\n";
    }
    else {
      if (iVar1 != 0x44) {
        if (iVar1 != 0x4b) goto switchD_0028395b_caseD_62;
        if (argc <= globalUtilOptind) {
          pcVar3 = "Command line switch \"-K\" should be followed by a positive integer.\n";
          goto LAB_00283b79;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        globalUtilOptind = iVar5 + 1;
        local_200.nLutSize = uVar2;
        if (((int)uVar2 < 2) || (local_200.nLutSizeMax < (int)uVar2)) {
          pcVar3 = "LUT size %d is not supported.\n";
LAB_00283b59:
          globalUtilOptind = iVar5 + 1;
          Abc_Print(-1,pcVar3,(ulong)uVar2);
          goto switchD_0028395b_caseD_62;
        }
        goto LAB_00283935;
      }
      if (globalUtilOptind < argc) {
        local_200.DelayTarget = atoi(argv[globalUtilOptind]);
        globalUtilOptind = iVar5 + 1;
        if (local_200.DelayTarget < 1) goto switchD_0028395b_caseD_62;
        goto LAB_00283935;
      }
      pcVar3 = "Command line switch \"-D\" should be followed by a floating point number.\n";
    }
  }
  else {
    switch(iVar1) {
    case 0x61:
      local_200.fAreaOnly = local_200.fAreaOnly ^ 1;
      goto LAB_00283935;
    case 0x62:
    case 0x66:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6c:
    case 0x6e:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x75:
      goto switchD_0028395b_caseD_62;
    case 99:
      local_200.fGenCnf = local_200.fGenCnf ^ 1;
      goto LAB_00283935;
    case 100:
      local_200.fFuncDsd = local_200.fFuncDsd ^ 1;
      goto LAB_00283935;
    case 0x65:
      local_200.fOptEdge = local_200.fOptEdge ^ 1;
      goto LAB_00283935;
    case 0x67:
      local_200.fPureAig = local_200.fPureAig ^ 1;
      goto LAB_00283935;
    case 0x6b:
      local_200.fCoarsen = local_200.fCoarsen ^ 1;
      goto LAB_00283935;
    case 0x6d:
      local_200.fCutMin = local_200.fCutMin ^ 1;
      goto LAB_00283935;
    case 0x73:
      local_200.fCutSimple = local_200.fCutSimple ^ 1;
      goto LAB_00283935;
    case 0x74:
      local_200.fCutHashing = local_200.fCutHashing ^ 1;
      goto LAB_00283935;
    case 0x76:
      local_200.fVerbose = local_200.fVerbose ^ 1;
      goto LAB_00283935;
    case 0x77:
      local_200.fVeryVerbose = local_200.fVeryVerbose ^ 1;
      goto LAB_00283935;
    }
    if (iVar1 == 0x50) {
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-P\" should be followed by a positive integer.\n";
        goto LAB_00283b79;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_200.nProcNum = uVar2;
LAB_00283ad8:
      globalUtilOptind = iVar5 + 1;
      if ((int)uVar2 < 0) {
switchD_0028395b_caseD_62:
        if (local_200.DelayTarget == -1) {
          builtin_strncpy(local_f8 + 8,"sible",6);
          builtin_strncpy(local_f8,"best pos",8);
        }
        else {
          sprintf(local_f8,"%d");
        }
        Abc_Print(-2,"usage: &kf [-KCPDW num] [-akmdcgtsvwh]\n");
        Abc_Print(-2,"\t           performs technology mapping of the network\n");
        Abc_Print(-2,"\t-K num   : LUT size for the mapping (2 <= K <= %d) [default = %d]\n",
                  (ulong)(uint)local_200.nLutSizeMax,(ulong)(uint)local_200.nLutSize);
        Abc_Print(-2,"\t-C num   : the max number of priority cuts (1 <= C <= %d) [default = %d]\n",
                  (ulong)(uint)local_200.nCutNumMax,(ulong)(uint)local_200.nCutNum);
        Abc_Print(-2,
                  "\t-P num   : the number of cut computation processes (0 <= P <= %d) [default = %d]\n"
                  ,(ulong)(uint)local_200.nProcNumMax,(ulong)(uint)local_200.nProcNum);
        Abc_Print(-2,"\t-D num   : sets the delay constraint for the mapping [default = %s]\n",
                  local_f8);
        Abc_Print(-2,
                  "\t-W num   : min frequency when printing functions with \"-w\" [default = %d]\n",
                  (ulong)(uint)local_200.nVerbLimit);
        pcVar4 = "yes";
        pcVar3 = "yes";
        if (local_200.fAreaOnly == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-a       : toggles area-oriented mapping [default = %s]\n",pcVar3);
        pcVar3 = "yes";
        if (local_200.fOptEdge == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-e       : toggles edge vs node minimization [default = %s]\n",pcVar3);
        pcVar3 = "yes";
        if (local_200.fCoarsen == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-k       : toggles coarsening the subject graph [default = %s]\n",pcVar3);
        pcVar3 = "yes";
        if (local_200.fCutMin == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-m       : toggles cut minimization [default = %s]\n",pcVar3);
        pcVar3 = "yes";
        if (local_200.fFuncDsd == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-d       : toggles using DSD to represent cut functions [default = %s]\n",
                  pcVar3);
        pcVar3 = "yes";
        if (local_200.fGenCnf == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-c       : toggles mapping for CNF generation [default = %s]\n",pcVar3);
        pcVar3 = "yes";
        if (local_200.fPureAig == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-g       : toggles generating AIG without mapping [default = %s]\n",pcVar3);
        pcVar3 = "yes";
        if (local_200.fCutHashing == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-t       : toggles cut computation using hash table [default = %s]\n",pcVar3
                 );
        pcVar3 = "yes";
        if (local_200.fCutSimple == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-s       : toggles cut computation using a simple method [default = %s]\n",
                  pcVar3);
        pcVar3 = "yes";
        if (local_200.fVerbose == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-v       : toggles verbose output [default = %s]\n",pcVar3);
        if (local_200.fVeryVerbose == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-w       : toggles very verbose output [default = %s]\n",pcVar4);
        pcVar3 = "\t-h       : prints the command usage\n";
        iVar5 = -2;
LAB_00283df7:
        Abc_Print(iVar5,pcVar3);
        return 1;
      }
      goto LAB_00283935;
    }
    if (iVar1 != 0x57) goto switchD_0028395b_caseD_62;
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_200.nVerbLimit = uVar2;
      goto LAB_00283ad8;
    }
    pcVar3 = "Command line switch \"-W\" should be followed by a positive integer.\n";
  }
LAB_00283b79:
  Abc_Print(-1,pcVar3);
  goto switchD_0028395b_caseD_62;
}

Assistant:

int Abc_CommandAbc9Kf( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Kf_ManSetDefaultPars( Jf_Par_t * pPars );
    extern Gia_Man_t * Kf_ManPerformMapping( Gia_Man_t * pGia, Jf_Par_t * pPars );
    char Buffer[200];
    Jf_Par_t Pars, * pPars = &Pars;
    Gia_Man_t * pNew; int c;
    Kf_ManSetDefaultPars( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "KCPDWaekmdcgtsvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLutSize < 2 || pPars->nLutSize > pPars->nLutSizeMax )
            {
                Abc_Print( -1, "LUT size %d is not supported.\n", pPars->nLutSize );
                goto usage;
            }
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nCutNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nCutNum < 1 || pPars->nCutNum > pPars->nCutNumMax )
            {
                Abc_Print( -1, "This number of cuts (%d) is not supported.\n", pPars->nCutNum );
                goto usage;
            }
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nProcNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nProcNum < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by a floating point number.\n" );
                goto usage;
            }
            pPars->DelayTarget = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->DelayTarget <= 0.0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nVerbLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nVerbLimit < 0 )
                goto usage;
            break;
        case 'a':
            pPars->fAreaOnly ^= 1;
            break;
        case 'e':
            pPars->fOptEdge ^= 1;
            break;
        case 'k':
            pPars->fCoarsen ^= 1;
            break;
        case 'm':
            pPars->fCutMin ^= 1;
            break;
        case 'd':
            pPars->fFuncDsd ^= 1;
            break;
        case 'c':
            pPars->fGenCnf ^= 1;
            break;
        case 'g':
            pPars->fPureAig ^= 1;
            break;
        case 't':
            pPars->fCutHashing ^= 1;
            break;
        case 's':
            pPars->fCutSimple ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
        default:
            goto usage;
        }
    }

    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Empty GIA network.\n" );
        return 1;
    }

    pNew = Kf_ManPerformMapping( pAbc->pGia, pPars );
    if ( pNew == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Kf(): Mapping into LUTs has failed.\n" );
        return 1;
    }
    Abc_FrameUpdateGia( pAbc, pNew );
    return 0;

usage:
    if ( pPars->DelayTarget == -1 )
        sprintf(Buffer, "best possible" );
    else
        sprintf(Buffer, "%d", pPars->DelayTarget );
    Abc_Print( -2, "usage: &kf [-KCPDW num] [-akmdcgtsvwh]\n" );
    Abc_Print( -2, "\t           performs technology mapping of the network\n" );
    Abc_Print( -2, "\t-K num   : LUT size for the mapping (2 <= K <= %d) [default = %d]\n", pPars->nLutSizeMax, pPars->nLutSize );
    Abc_Print( -2, "\t-C num   : the max number of priority cuts (1 <= C <= %d) [default = %d]\n", pPars->nCutNumMax, pPars->nCutNum );
    Abc_Print( -2, "\t-P num   : the number of cut computation processes (0 <= P <= %d) [default = %d]\n", pPars->nProcNumMax, pPars->nProcNum );
    Abc_Print( -2, "\t-D num   : sets the delay constraint for the mapping [default = %s]\n", Buffer );
    Abc_Print( -2, "\t-W num   : min frequency when printing functions with \"-w\" [default = %d]\n", pPars->nVerbLimit );
    Abc_Print( -2, "\t-a       : toggles area-oriented mapping [default = %s]\n", pPars->fAreaOnly? "yes": "no" );
    Abc_Print( -2, "\t-e       : toggles edge vs node minimization [default = %s]\n", pPars->fOptEdge? "yes": "no" );
    Abc_Print( -2, "\t-k       : toggles coarsening the subject graph [default = %s]\n", pPars->fCoarsen? "yes": "no" );
    Abc_Print( -2, "\t-m       : toggles cut minimization [default = %s]\n", pPars->fCutMin? "yes": "no" );
    Abc_Print( -2, "\t-d       : toggles using DSD to represent cut functions [default = %s]\n", pPars->fFuncDsd? "yes": "no" );
    Abc_Print( -2, "\t-c       : toggles mapping for CNF generation [default = %s]\n", pPars->fGenCnf? "yes": "no" );
    Abc_Print( -2, "\t-g       : toggles generating AIG without mapping [default = %s]\n", pPars->fPureAig? "yes": "no" );
    Abc_Print( -2, "\t-t       : toggles cut computation using hash table [default = %s]\n", pPars->fCutHashing? "yes": "no" );
    Abc_Print( -2, "\t-s       : toggles cut computation using a simple method [default = %s]\n", pPars->fCutSimple? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggles verbose output [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggles very verbose output [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : prints the command usage\n");
    return 1;
}